

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_store.cpp
# Opt level: O3

void Am_State_Store::Invoke(void)

{
  Am_State_Store *this;
  
  for (this = invalidation_list; this != (Am_State_Store *)0x0; this = this->next) {
    Invalidate(this);
  }
  invalidation_list = (Am_State_Store *)0x0;
  return;
}

Assistant:

void
Am_State_Store::Invoke()
{
#ifdef DEBUG
  Am_State_Store *current = invalidation_list;
  Am_Object obj;
  while (current) {
    obj = current->self;
    int was_inprogress =
        obj.Get(Am_OBJECT_IN_PROGRESS, Am_RETURN_ZERO_ON_ERROR);
    if (was_inprogress & 1) {
      std::cerr << "** Invalidate on object " << obj
                << " but crashed last time, so skipping it.\n"
                << std::flush;
      obj.Set(Am_OBJECT_IN_PROGRESS, 0);
    } else {
      obj.Set(Am_OBJECT_IN_PROGRESS, 1, Am_OK_IF_NOT_THERE);
      current->Invalidate();
      obj.Set(Am_OBJECT_IN_PROGRESS, 0);
    }
    current = current->next;
  }
  invalidation_list = nullptr;
}
#else //not debugging
  Am_State_Store *current = invalidation_list;
  while (current) {
    current->Invalidate();
    current = current->next;
  }
  invalidation_list = nullptr;
}